

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<QString>::QList<QLatin1String,void>(QList<QString> *this,QLatin1String *str)

{
  QLatin1StringView latin1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).size = 0;
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (QString *)0x0;
  latin1.m_size = str->m_size;
  latin1.m_data = str->m_data;
  QString::QString((QString *)&local_30,latin1);
  emplaceBack<QString>(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline explicit QList(const String &str)
    { append(str); }